

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

UBool icu_63::enumExtNames(UChar32 start,UChar32 end,UEnumCharNamesFn *fn,void *context)

{
  UBool UVar1;
  uint16_t uVar2;
  char buffer [200];
  
  if (fn != (UEnumCharNamesFn *)0x0) {
    for (; start <= end; start = start + 1) {
      uVar2 = getExtName(start,buffer,200);
      buffer[uVar2] = '\0';
      if ((uVar2 != 0) &&
         (UVar1 = (*fn)(context,start,U_EXTENDED_CHAR_NAME,buffer,(uint)uVar2), UVar1 == '\0')) {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

static UBool
enumExtNames(UChar32 start, UChar32 end,
             UEnumCharNamesFn *fn, void *context)
{
    if(fn!=DO_FIND_NAME) {
        char buffer[200];
        uint16_t length;
        
        while(start<=end) {
            buffer[length = getExtName(start, buffer, sizeof(buffer))] = 0;
            /* here, we assume that the buffer is large enough */
            if(length>0) {
                if(!fn(context, start, U_EXTENDED_CHAR_NAME, buffer, length)) {
                    return FALSE;
                }
            }
            ++start;
        }
    }

    return TRUE;
}